

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O1

char * __thiscall HttpHeaderBase::getField(HttpHeaderBase *this,FieldType type)

{
  long lVar1;
  
  if ((long)this->mNumFields < 1) {
    return (char *)0x0;
  }
  lVar1 = 0;
  do {
    if (*(int *)((long)&this->mFields[0].mType + lVar1) == type) {
      return *(char **)((long)&this->mFields[0].mData + lVar1);
    }
    lVar1 = lVar1 + 0x10;
  } while ((long)this->mNumFields * 0x10 != lVar1);
  return (char *)0x0;
}

Assistant:

const char *HttpHeaderBase::getField(FieldMap::FieldType type) const
{
	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
			return mFields[i].mData;
	}
	
	return NULL;
}